

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::TextureVkImpl::InitSparseProperties(TextureVkImpl *this)

{
  Uint64 UVar1;
  PFN_vkGetImageSparseMemoryRequirements p_Var2;
  bool bVar3;
  SPARSE_TEXTURE_FLAGS SVar4;
  Uint32 UVar5;
  uint uVar6;
  Char *pCVar7;
  VulkanLogicalDevice *this_00;
  VkImage pVVar8;
  VkDevice pVVar9;
  type Args_1;
  TextureFormatAttribs *this_01;
  char (*in_RCX) [29];
  ulong uVar10;
  char (*Args_1_00) [100];
  undefined1 local_210 [8];
  string msg_9;
  Uint32 BytesPerTile;
  Uint32 BytesPerBlock;
  TextureFormatAttribs *FmtAttribs;
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  SparseTextureProperties *Props;
  VkSparseImageMemoryRequirements SparseReq [2];
  uint32_t local_8c;
  undefined1 auStack_88 [4];
  uint32_t SparseReqCount;
  VkMemoryRequirements MemReq;
  VulkanLogicalDevice *LogicalDevice;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  TextureVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[26],char[29]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Desc.Usage == USAGE_SPARSE",in_RCX);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [29])0x3cc;
    DebugAssertionFailed
              (pCVar7,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cc);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar3 = std::operator==(&(this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps,
                          (nullptr_t)0x0);
  if (!bVar3) {
    FormatString<char[26],char[26]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSparseProps == nullptr",(char (*) [26])in_RCX);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cd);
    std::__cxx11::string::~string((string *)local_60);
  }
  std::make_unique<Diligent::SparseTextureProperties>();
  std::
  unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ::operator=(&(this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps,
              (unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
               *)&LogicalDevice);
  std::
  unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ::~unique_ptr((unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
                 *)&LogicalDevice);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       .m_pDevice);
  MemReq._16_8_ = this_00;
  pVVar8 = GetVkImage(this);
  VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
            ((VkMemoryRequirements *)auStack_88,this_00,pVVar8);
  p_Var2 = vkGetImageSparseMemoryRequirements;
  local_8c = 0;
  pVVar9 = VulkanUtilities::VulkanLogicalDevice::GetVkDevice((VulkanLogicalDevice *)MemReq._16_8_);
  pVVar8 = GetVkImage(this);
  (*p_Var2)(pVVar9,pVVar8,&local_8c,(VkSparseImageMemoryRequirements *)0x0);
  if (local_8c != 1) {
    LogError<true,char[49]>
              (false,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3d8,(char (*) [49])"Sparse memory requirements for texture must be 1");
  }
  memset(&Props,0,0x60);
  p_Var2 = vkGetImageSparseMemoryRequirements;
  pVVar9 = VulkanUtilities::VulkanLogicalDevice::GetVkDevice((VulkanLogicalDevice *)MemReq._16_8_);
  pVVar8 = GetVkImage(this);
  (*p_Var2)(pVVar9,pVVar8,&local_8c,(VkSparseImageMemoryRequirements *)&Props);
  Args_1 = std::
           unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
           ::operator*(&(this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps);
  Args_1->MipTailOffset = SparseReq[0].imageMipTailSize;
  Args_1->MipTailSize = SparseReq[0]._16_8_;
  Args_1->MipTailStride = SparseReq[0].imageMipTailOffset;
  Args_1->FirstMipInTail = SparseReq[0].formatProperties.imageGranularity.depth;
  Args_1->TileSize[0] = Props._4_4_;
  Args_1->TileSize[1] = SparseReq[0].formatProperties.aspectMask;
  uVar10 = (ulong)SparseReq[0].formatProperties.imageGranularity.width;
  Args_1->TileSize[2] = SparseReq[0].formatProperties.imageGranularity.width;
  SVar4 = VkSparseImageFormatFlagsToSparseTextureFlags
                    (SparseReq[0].formatProperties.imageGranularity.height);
  Args_1_00 = (char (*) [100])CONCAT71((int7)(uVar10 >> 8),SVar4);
  Args_1->Flags = SVar4;
  UVar5 = TextureDesc::GetArraySize
                    (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc);
  if (UVar5 == 1) {
    if ((_auStack_88 <= Args_1->MipTailOffset) &&
       ((Args_1->MipTailOffset != _auStack_88 || (Args_1->MipTailSize != 0)))) {
      FormatString<char[26],char[100]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0)"
                 ,Args_1_00);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3ea);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if (_auStack_88 < Args_1->MipTailOffset + Args_1->MipTailSize) {
      FormatString<char[26],char[55]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= MemReq.size",
                 (char (*) [55])Args_1);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3eb);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    Args_1->MipTailStride = 0;
  }
  else {
    SVar4 = Diligent::operator&(Args_1->Flags,SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL);
    if (SVar4 == SPARSE_TEXTURE_FLAG_NONE) {
      if (Args_1->MipTailStride == 0) {
        FormatString<char[26],char[24]>
                  ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Props.MipTailStride > 0",(char (*) [24])Args_1_00);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"InitSparseProperties",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x3f3);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
    }
    else {
      Args_1->MipTailStride = 0;
    }
    UVar1 = Args_1->MipTailStride;
    UVar5 = TextureDesc::GetArraySize
                      (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_Desc);
    if (UVar1 * (long)(ulong)UVar5 - _auStack_88 != 0) {
      FormatString<char[26],char[59]>
                ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size",
                 (char (*) [59])(ulong)UVar5);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f5);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    if (Args_1->MipTailStride % MemReq.size != 0) {
      FormatString<char[26],char[44]>
                ((string *)((long)&msg_7.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride % MemReq.alignment == 0",(char (*) [44])0x0);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f6);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    if (Args_1->MipTailStride <= Args_1->MipTailOffset) {
      FormatString<char[26],char[42]>
                ((string *)((long)&msg_8.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset < Props.MipTailStride",(char (*) [42])Args_1);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f7);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    if (Args_1->MipTailStride < Args_1->MipTailOffset + Args_1->MipTailSize) {
      FormatString<char[26],char[63]>
                ((string *)&FmtAttribs,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride",
                 (char (*) [63])Args_1);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f8);
      std::__cxx11::string::~string((string *)&FmtAttribs);
    }
  }
  Args_1->AddressSpaceSize = _auStack_88;
  uVar6 = StaticCast<unsigned_int,unsigned_long>(&MemReq.size);
  Args_1->BlockSize = uVar6;
  this_01 = GetTextureFormatAttribs
                      ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       .m_Desc.Format);
  msg_9.field_2._12_4_ = TextureFormatAttribs::GetElementSize(this_01);
  msg_9.field_2._8_4_ =
       (Args_1->TileSize[0] / (uint)this_01->BlockWidth) *
       (Args_1->TileSize[1] / (uint)this_01->BlockHeight) * Args_1->TileSize[2] *
       (this->super_TextureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
       .m_Desc.SampleCount * msg_9.field_2._12_4_;
  if (msg_9.field_2._8_4_ != Args_1->BlockSize) {
    FormatString<char[52]>
              ((string *)local_210,
               (char (*) [52])"Expected that memory alignment equals to block size");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x406);
    std::__cxx11::string::~string((string *)local_210);
  }
  return;
}

Assistant:

void TextureVkImpl::InitSparseProperties() noexcept(false)
{
    VERIFY_EXPR(m_Desc.Usage == USAGE_SPARSE);
    VERIFY_EXPR(m_pSparseProps == nullptr);

    m_pSparseProps = std::make_unique<SparseTextureProperties>();

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    const VkMemoryRequirements                  MemReq        = LogicalDevice.GetImageMemoryRequirements(GetVkImage());

    // If the image was not created with VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT, then pSparseMemoryRequirementCount will be set to zero.
    uint32_t SparseReqCount = 0;
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, nullptr);
    if (SparseReqCount != 1)
        LOG_ERROR_AND_THROW("Sparse memory requirements for texture must be 1");

    // Texture with depth-stencil format may be implemented with two memory blocks per tile.
    VkSparseImageMemoryRequirements SparseReq[2] = {};
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, SparseReq);

    SparseTextureProperties& Props{*m_pSparseProps};
    Props.MipTailOffset  = SparseReq[0].imageMipTailOffset;
    Props.MipTailSize    = SparseReq[0].imageMipTailSize;
    Props.MipTailStride  = SparseReq[0].imageMipTailStride;
    Props.FirstMipInTail = SparseReq[0].imageMipTailFirstLod;
    Props.TileSize[0]    = SparseReq[0].formatProperties.imageGranularity.width;
    Props.TileSize[1]    = SparseReq[0].formatProperties.imageGranularity.height;
    Props.TileSize[2]    = SparseReq[0].formatProperties.imageGranularity.depth;
    Props.Flags          = VkSparseImageFormatFlagsToSparseTextureFlags(SparseReq[0].formatProperties.flags);

    if (m_Desc.GetArraySize() == 1)
    {
        VERIFY_EXPR(Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0));
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= MemReq.size);
        Props.MipTailStride = 0;
    }
    else
    {
        if (Props.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
            Props.MipTailStride = 0;
        else
            VERIFY_EXPR(Props.MipTailStride > 0);

        VERIFY_EXPR(Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size);
        VERIFY_EXPR(Props.MipTailStride % MemReq.alignment == 0);
        VERIFY_EXPR(Props.MipTailOffset < Props.MipTailStride);
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride);
    }

    Props.AddressSpaceSize = MemReq.size;
    Props.BlockSize        = StaticCast<Uint32>(MemReq.alignment);

#ifdef DILIGENT_DEBUG
    const TextureFormatAttribs& FmtAttribs    = GetTextureFormatAttribs(m_Desc.Format);
    const Uint32                BytesPerBlock = FmtAttribs.GetElementSize();
    const Uint32                BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * m_Desc.SampleCount * BytesPerBlock;

    VERIFY(BytesPerTile == Props.BlockSize, "Expected that memory alignment equals to block size");
#endif
}